

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_579bf::dot_grad_test_calculation_Test::TestBody
          (dot_grad_test_calculation_Test *this)

{
  double *pdVar1;
  char *pcVar2;
  AssertHelper local_e8;
  array<unsigned_int,_2UL> local_e0;
  AssertionResult gtest_ar;
  matrix grad_W;
  matrix grad_x;
  dotgrad_ret_type res;
  
  dnet::nn::cal_dot_grad
            (&res,(this->super_dot_grad_test)._W,(this->super_dot_grad_test)._x,
             (this->super_dot_grad_test)._grad_y);
  dnet::data_types::tensor<double,_2U>::tensor
            (&grad_W.super_tensor<double,_2U>,(tensor<double,_2U> *)&res);
  dnet::data_types::tensor<double,_2U>::tensor
            (&grad_x.super_tensor<double,_2U>,&res.grad_x.super_tensor<double,_2U>);
  local_e0._M_elems[0] = 0;
  local_e0._M_elems[1] = 0;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_x.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 0x46;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_x[{0, 0}])","70",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 1;
  local_e0._M_elems[1] = 0;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_x.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 0x50;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_x[{1, 0}])","80",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 2;
  local_e0._M_elems[1] = 0;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_x.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 0x5a;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_x[{2, 0}])","90",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 0;
  local_e0._M_elems[1] = 0;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_W.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_W[{0, 0}])","1",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 0;
  local_e0._M_elems[1] = 2;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_W.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_W[{0, 2}])","3",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x4f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 1;
  local_e0._M_elems[1] = 1;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_W.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_W[{1, 1}])","4",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x50,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_e0._M_elems[0] = 2;
  local_e0._M_elems[1] = 3;
  pdVar1 = dnet::data_types::tensor<double,_2U>::operator[]
                     (&grad_W.super_tensor<double,_2U>,&local_e0);
  local_e8.data_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<double,int>
            ((internal *)&gtest_ar,"(grad_W[{2, 3}])","12",pdVar1,(int *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/Linyxus[P]deeper-net/src/nn/operators/op_test.cc"
               ,0x51,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e8,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&grad_x);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&grad_W);
  dnet::nn::dotgrad_ret_type::~dotgrad_ret_type(&res);
  return;
}

Assistant:

TEST_F(dot_grad_test, calculation)
    {
        auto res = cal_dot_grad(*_W, *_x, *_grad_y);
        auto grad_W = res.grad_w;
        auto grad_x = res.grad_x;
        EXPECT_EQ((grad_x[{0, 0}]), 70);
        EXPECT_EQ((grad_x[{1, 0}]), 80);
        EXPECT_EQ((grad_x[{2, 0}]), 90);
        EXPECT_EQ((grad_W[{0, 0}]), 1);
        EXPECT_EQ((grad_W[{0, 2}]), 3);
        EXPECT_EQ((grad_W[{1, 1}]), 4);
        EXPECT_EQ((grad_W[{2, 3}]), 12);
    }